

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::SegmentInfo::Parse(SegmentInfo *this)

{
  long lVar1;
  longlong lVar2;
  long lVar3;
  long in_RDI;
  double rollover_check;
  long status_4;
  long status_3;
  long status_2;
  long status_1;
  long status;
  longlong size;
  longlong id;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  longlong *in_stack_ffffffffffffff98;
  longlong *in_stack_ffffffffffffffa0;
  longlong in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  IMkvReader *in_stack_ffffffffffffffb8;
  IMkvReader *in_stack_ffffffffffffffc8;
  long local_30;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 8);
  lVar3 = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10);
  *(undefined8 *)(in_RDI + 0x28) = 1000000;
  *(undefined8 *)(in_RDI + 0x30) = 0xbff0000000000000;
  do {
    if (lVar3 <= local_20) {
      if (9.223372036854776e+18 < *(double *)(in_RDI + 0x30) * (double)*(long *)(in_RDI + 0x28)) {
        return -2;
      }
      if (local_20 != lVar3) {
        return -2;
      }
      return 0;
    }
    lVar1 = ParseElementHeader(in_stack_ffffffffffffffb8,(longlong *)in_stack_ffffffffffffffb0,
                               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff98);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (local_30 == 0x2ad7b1) {
      lVar2 = UnserializeUInt(in_stack_ffffffffffffffb8,(longlong)in_stack_ffffffffffffffb0,
                              in_stack_ffffffffffffffa8);
      *(longlong *)(in_RDI + 0x28) = lVar2;
      if (*(long *)(in_RDI + 0x28) < 1) {
        return -2;
      }
    }
    else if (local_30 == 0x4489) {
      in_stack_ffffffffffffffb8 =
           (IMkvReader *)
           UnserializeFloat(in_stack_ffffffffffffffc8,lVar1,(longlong)in_stack_ffffffffffffffb8,
                            (double *)in_stack_ffffffffffffffb0);
      if ((long)in_stack_ffffffffffffffb8 < 0) {
        return (long)in_stack_ffffffffffffffb8;
      }
      if (*(double *)(in_RDI + 0x30) <= 0.0 && *(double *)(in_RDI + 0x30) != 0.0) {
        return -2;
      }
    }
    else if (local_30 == 0x4d80) {
      lVar1 = UnserializeString(in_stack_ffffffffffffffc8,lVar1,(longlong)in_stack_ffffffffffffffb8,
                                in_stack_ffffffffffffffb0);
      if (lVar1 != 0) {
        return lVar1;
      }
      in_stack_ffffffffffffffb0 = (char **)0x0;
    }
    else if (local_30 == 0x5741) {
      lVar1 = UnserializeString(in_stack_ffffffffffffffc8,lVar1,(longlong)in_stack_ffffffffffffffb8,
                                in_stack_ffffffffffffffb0);
      if (lVar1 != 0) {
        return lVar1;
      }
      in_stack_ffffffffffffffa8 = 0;
    }
    else if (local_30 == 0x7ba9) {
      lVar1 = UnserializeString(in_stack_ffffffffffffffc8,lVar1,(longlong)in_stack_ffffffffffffffb8,
                                in_stack_ffffffffffffffb0);
      if (lVar1 != 0) {
        return lVar1;
      }
      in_stack_ffffffffffffffa0 = (longlong *)0x0;
    }
    local_20 = (long)&in_stack_ffffffffffffffc8->_vptr_IMkvReader + local_20;
    if (lVar3 < local_20) {
      return -2;
    }
  } while( true );
}

Assistant:

long SegmentInfo::Parse() {
  assert(m_pMuxingAppAsUTF8 == NULL);
  assert(m_pWritingAppAsUTF8 == NULL);
  assert(m_pTitleAsUTF8 == NULL);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  m_timecodeScale = 1000000;
  m_duration = -1;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvTimecodeScale) {
      m_timecodeScale = UnserializeUInt(pReader, pos, size);

      if (m_timecodeScale <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDuration) {
      const long status = UnserializeFloat(pReader, pos, size, m_duration);

      if (status < 0)
        return status;

      if (m_duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvMuxingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pMuxingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvWritingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pWritingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTitle) {
      const long status = UnserializeString(pReader, pos, size, m_pTitleAsUTF8);

      if (status)
        return status;
    }

    pos += size;

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  const double rollover_check = m_duration * m_timecodeScale;
  if (rollover_check > static_cast<double>(LLONG_MAX))
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}